

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void __thiscall
server_grammar_trigger::server_grammar_trigger(server_grammar_trigger *this,json *in)

{
  const_reference pvVar1;
  int ret;
  common_grammar_trigger_type local_48;
  undefined4 uStack_44;
  long local_38 [2];
  
  (this->value).value._M_dataplus._M_p = (pointer)&(this->value).value.field_2;
  (this->value).value._M_string_length = 0;
  (this->value).value.field_2._M_local_buf[0] = '\0';
  (this->value).token = -1;
  pvVar1 = nlohmann::json_abi_v3_11_3::
           basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::at<const_char_(&)[5],_0>(in,(char (*) [5])0x27b444);
  local_48 = COMMON_GRAMMAR_TRIGGER_TYPE_TOKEN;
  nlohmann::json_abi_v3_11_3::detail::
  from_json<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_int,_0>
            (pvVar1,(int *)&local_48);
  (this->value).type = local_48;
  pvVar1 = nlohmann::json_abi_v3_11_3::
           basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::at<const_char_(&)[6],_0>(in,(char (*) [6])0x286ff1);
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_48,pvVar1);
  std::__cxx11::string::operator=((string *)&(this->value).value,(string *)&local_48);
  if ((long *)CONCAT44(uStack_44,local_48) != local_38) {
    operator_delete((long *)CONCAT44(uStack_44,local_48),local_38[0] + 1);
  }
  if ((this->value).type == COMMON_GRAMMAR_TRIGGER_TYPE_TOKEN) {
    pvVar1 = nlohmann::json_abi_v3_11_3::
             basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::at<const_char_(&)[6],_0>(in,(char (*) [6])0x28673a);
    local_48 = COMMON_GRAMMAR_TRIGGER_TYPE_TOKEN;
    nlohmann::json_abi_v3_11_3::detail::
    from_json<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_int,_0>
              (pvVar1,(int *)&local_48);
    (this->value).token = local_48;
  }
  return;
}

Assistant:

server_grammar_trigger(const json & in) {
        value.type = (common_grammar_trigger_type) in.at("type").get<int>();
        value.value = in.at("value").get<std::string>();
        if (value.type == COMMON_GRAMMAR_TRIGGER_TYPE_TOKEN) {
            value.token = (llama_token) in.at("token").get<int>();
        }
    }